

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

int Saig_StrSimIsEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int local_34;
  int i;
  uint *pSims1;
  uint *pSims0;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  
  local_34 = 0;
  while( true ) {
    if (0xf < local_34) {
      return 1;
    }
    if (*(int *)((long)(pObj0->field_5).pData + (long)local_34 * 4) !=
        *(int *)((long)(pObj1->field_5).pData + (long)local_34 * 4)) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int Saig_StrSimIsEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    unsigned * pSims0 = (unsigned *)pObj0->pData;
    unsigned * pSims1 = (unsigned *)pObj1->pData;
    int i;
    for ( i = 0; i < SAIG_WORDS; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}